

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawMsg.h
# Opt level: O0

void __thiscall SocketPP::RawMsg::RawMsg(RawMsg *this,RawMsg *msg)

{
  RawMsg *msg_local;
  RawMsg *this_local;
  
  this->len_ = 0;
  this->data_ = (byte *)0x0;
  initMsg(this,msg->data_,msg->len_);
  return;
}

Assistant:

RawMsg(const RawMsg& msg) {
        initMsg(msg.data_, msg.len_);
    }